

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::RsCaseItemSyntax*>::
emplaceRealloc<slang::syntax::RsCaseItemSyntax*>
          (SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *this,pointer pos,
          RsCaseItemSyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator ppRVar4;
  long lVar5;
  pointer ppRVar6;
  EVP_PKEY_CTX *ctx;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  RsCaseItemSyntax **in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *)0x7a39fb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::calculateGrowth
                    (in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  ppRVar4 = SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::begin(in_RDI);
  lVar5 = (long)__last - (long)ppRVar4;
  ppRVar6 = (pointer)operator_new(0x7a3a5a);
  ppRVar6[lVar5 >> 3] = (RsCaseItemSyntax *)*in_RDX;
  ppRVar4 = SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::end(in_RDI);
  if (in_RSI == ppRVar4) {
    ppRVar4 = SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::end(in_RDI);
    std::uninitialized_move<slang::syntax::RsCaseItemSyntax**,slang::syntax::RsCaseItemSyntax**>
              (in_RSI,__last,ppRVar4);
  }
  else {
    SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::begin(in_RDI);
    std::uninitialized_move<slang::syntax::RsCaseItemSyntax**,slang::syntax::RsCaseItemSyntax**>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::end(in_RDI);
    std::uninitialized_move<slang::syntax::RsCaseItemSyntax**,slang::syntax::RsCaseItemSyntax**>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = ppRVar6;
  return ppRVar6 + (lVar5 >> 3);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}